

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

void __thiscall icu_63::ResourceBundle::ResourceBundle(ResourceBundle *this,ResourceBundle *other)

{
  UResourceBundle *pUVar1;
  UErrorCode local_1c;
  ResourceBundle *pRStack_18;
  UErrorCode status;
  ResourceBundle *other_local;
  ResourceBundle *this_local;
  
  pRStack_18 = other;
  other_local = this;
  UObject::UObject(&this->super_UObject,&other->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__ResourceBundle_004ad5c0;
  this->fLocale = (Locale *)0x0;
  local_1c = U_ZERO_ERROR;
  if (pRStack_18->fResource == (UResourceBundle *)0x0) {
    this->fResource = (UResourceBundle *)0x0;
  }
  else {
    pUVar1 = ures_copyResb_63((UResourceBundle *)0x0,pRStack_18->fResource,&local_1c);
    this->fResource = pUVar1;
  }
  return;
}

Assistant:

ResourceBundle::ResourceBundle(const ResourceBundle &other)
                              :UObject(other), fLocale(NULL)
{
    UErrorCode status = U_ZERO_ERROR;

    if (other.fResource) {
        fResource = ures_copyResb(0, other.fResource, &status);
    } else {
        /* Copying a bad resource bundle */
        fResource = NULL;
    }
}